

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

void Fossilize::filter_feature_enablement
               (VkPhysicalDeviceFeatures2 *pdf,VulkanFeatures *features,
               VkPhysicalDeviceFeatures2 *target_features,char **active_extensions,
               size_t *out_extension_count)

{
  VkBool32 VVar1;
  int iVar2;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *feature;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  char *ext;
  VkBool32 VVar7;
  int *piVar8;
  VkBool32 VVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  void **ppvVar12;
  bool bVar13;
  
  VVar7 = (features->fragment_shading_rate).pipelineFragmentShadingRate;
  VVar9 = (features->fragment_shading_rate).primitiveFragmentShadingRate;
  VVar1 = (features->fragment_shading_rate).attachmentFragmentShadingRate;
  if (VVar9 == 1 || (VVar1 == 1 || VVar7 == 1)) {
    (features->shading_rate_nv).shadingRateImage = 0;
    (features->shading_rate_nv).shadingRateCoarseSampleOrder = 0;
    (features->fragment_density).fragmentDensityMap = 0;
  }
  if (target_features == (VkPhysicalDeviceFeatures2 *)0x0) {
    (pdf->features).robustBufferAccess = 0;
    (features->robustness2).nullDescriptor = 0;
    (features->robustness2).robustBufferAccess2 = 0;
    (features->robustness2).robustImageAccess2 = 0;
    (features->image_robustness).robustImageAccess = 0;
    (features->fragment_shading_rate_enums).fragmentShadingRateEnums = 0;
    (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = 0;
    (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = 0;
    (features->fragment_shading_rate).pipelineFragmentShadingRate = 0;
    (features->fragment_shading_rate).primitiveFragmentShadingRate = 0;
    (features->fragment_shading_rate).attachmentFragmentShadingRate = 0;
    (features->mesh_shader).taskShader = 0;
    (features->mesh_shader).meshShader = 0;
    (features->mesh_shader).multiviewMeshShader = 0;
    (features->mesh_shader).primitiveFragmentShadingRateMeshShader = 0;
    (features->mesh_shader).meshShaderQueries = 0;
    (features->mesh_shader_nv).taskShader = 0;
    (features->mesh_shader_nv).meshShader = 0;
    (features->descriptor_buffer).descriptorBuffer = 0;
    (features->descriptor_buffer).descriptorBufferCaptureReplay = 0;
    (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = 0;
    (features->descriptor_buffer).descriptorBufferPushDescriptors = 0;
    (features->shader_object).shaderObject = 0;
    (features->primitives_generated_query).primitivesGeneratedQuery = 0;
    (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = 0;
    (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = 0;
    (features->image_2d_view_of_3d).image2DViewOf3D = 0;
    (features->image_2d_view_of_3d).sampler2DViewOf3D = 0;
    goto LAB_001074c3;
  }
  if ((pdf->features).robustBufferAccess == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)((target_features->features).robustBufferAccess != 0);
  }
  (pdf->features).robustBufferAccess = uVar5;
  piVar4 = (int *)target_features->pNext;
  for (piVar3 = piVar4; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9f2730) goto LAB_00106f82;
  }
  piVar3 = (int *)0x0;
LAB_00106f82:
  piVar8 = piVar4;
  if (piVar3 == (int *)0x0) {
    (features->robustness2).nullDescriptor = 0;
    (features->robustness2).robustBufferAccess2 = 0;
    (features->robustness2).robustImageAccess2 = 0;
  }
  else {
    VVar10 = 0;
    VVar11 = 0;
    if ((features->robustness2).robustBufferAccess2 != 0) {
      VVar11 = (VkBool32)(piVar3[4] != 0);
    }
    (features->robustness2).robustBufferAccess2 = VVar11;
    if ((features->robustness2).robustImageAccess2 != 0) {
      VVar10 = (VkBool32)(piVar3[5] != 0);
    }
    (features->robustness2).robustImageAccess2 = VVar10;
    if ((features->robustness2).nullDescriptor == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)(piVar3[6] != 0);
    }
    (features->robustness2).nullDescriptor = uVar5;
  }
  for (; piVar8 != (int *)0x0; piVar8 = *(int **)(piVar8 + 2)) {
    if (*piVar8 == 0x3b9fe698) goto LAB_0010702b;
  }
  piVar8 = (int *)0x0;
LAB_0010702b:
  VVar10 = 0;
  if ((piVar8 != (int *)0x0) && ((features->image_robustness).robustImageAccess != 0)) {
    VVar10 = (VkBool32)(piVar8[4] != 0);
  }
  (features->image_robustness).robustImageAccess = VVar10;
  for (piVar3 = piVar4; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9fc371) goto LAB_0010707a;
  }
  piVar3 = (int *)0x0;
LAB_0010707a:
  piVar8 = piVar4;
  if (piVar3 == (int *)0x0) {
    (features->fragment_shading_rate_enums).fragmentShadingRateEnums = 0;
    (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = 0;
    (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = 0;
  }
  else {
    VVar10 = 0;
    VVar11 = 0;
    if ((features->fragment_shading_rate_enums).fragmentShadingRateEnums != 0) {
      VVar11 = (VkBool32)(piVar3[4] != 0);
    }
    (features->fragment_shading_rate_enums).fragmentShadingRateEnums = VVar11;
    if ((features->fragment_shading_rate_enums).noInvocationFragmentShadingRates != 0) {
      VVar10 = (VkBool32)(piVar3[6] != 0);
    }
    (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = VVar10;
    if ((features->fragment_shading_rate_enums).supersampleFragmentShadingRates == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)(piVar3[5] != 0);
    }
    (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = uVar5;
  }
  for (; piVar8 != (int *)0x0; piVar8 = *(int **)(piVar8 + 2)) {
    if (*piVar8 == 0x3b9e3cd3) goto LAB_00107123;
  }
  piVar8 = (int *)0x0;
LAB_00107123:
  if (piVar8 == (int *)0x0) {
    (features->fragment_shading_rate).pipelineFragmentShadingRate = 0;
    (features->fragment_shading_rate).primitiveFragmentShadingRate = 0;
LAB_0010717b:
    uVar5 = 0;
  }
  else {
    VVar10 = 0;
    VVar11 = 0;
    if (VVar7 != 0) {
      VVar11 = (VkBool32)(piVar8[4] != 0);
    }
    (features->fragment_shading_rate).pipelineFragmentShadingRate = VVar11;
    if (VVar9 != 0) {
      VVar10 = (VkBool32)(piVar8[5] != 0);
    }
    (features->fragment_shading_rate).primitiveFragmentShadingRate = VVar10;
    if (VVar1 == 0) goto LAB_0010717b;
    uVar5 = (uint)(piVar8[6] != 0);
  }
  (features->fragment_shading_rate).attachmentFragmentShadingRate = uVar5;
  for (; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
    if (*piVar4 == 0x3b9fcb40) goto LAB_001071a7;
  }
  piVar4 = (int *)0x0;
LAB_001071a7:
  if (piVar4 == (int *)0x0) {
    (features->mesh_shader).taskShader = 0;
    (features->mesh_shader).meshShader = 0;
    (features->mesh_shader).multiviewMeshShader = 0;
    (features->mesh_shader).primitiveFragmentShadingRateMeshShader = 0;
    (features->mesh_shader).meshShaderQueries = 0;
  }
  else {
    uVar5 = 0;
    VVar7 = 0;
    if ((features->mesh_shader).taskShader != 0) {
      VVar7 = (VkBool32)(piVar4[4] != 0);
    }
    (features->mesh_shader).taskShader = VVar7;
    if ((features->mesh_shader).meshShader != 0) {
      uVar5 = (uint)(piVar4[5] != 0);
    }
    (features->mesh_shader).meshShader = uVar5;
    uVar5 = 0;
    VVar7 = 0;
    if ((features->mesh_shader).multiviewMeshShader != 0) {
      VVar7 = (VkBool32)(piVar4[6] != 0);
    }
    (features->mesh_shader).multiviewMeshShader = VVar7;
    if ((features->mesh_shader).meshShaderQueries != 0) {
      uVar5 = (uint)(piVar4[8] != 0);
    }
    (features->mesh_shader).meshShaderQueries = uVar5;
    uVar5 = 0;
    if (((features->mesh_shader).primitiveFragmentShadingRateMeshShader != 0) &&
       (uVar5 = 0, (features->fragment_shading_rate).primitiveFragmentShadingRate != 0)) {
      uVar5 = (uint)(piVar4[7] != 0);
    }
    (features->mesh_shader).primitiveFragmentShadingRateMeshShader = uVar5;
  }
  piVar3 = (int *)target_features->pNext;
  for (piVar8 = piVar3; piVar8 != (int *)0x0; piVar8 = *(int **)(piVar8 + 2)) {
    if (*piVar8 == 0x3b9ddf10) goto LAB_00107283;
  }
  piVar8 = (int *)0x0;
LAB_00107283:
  if (piVar8 == (int *)0x0) {
    (features->mesh_shader_nv).taskShader = 0;
    (features->mesh_shader_nv).meshShader = 0;
  }
  else {
    VVar7 = 0;
    VVar9 = 0;
    if ((features->mesh_shader_nv).taskShader != 0) {
      VVar9 = (VkBool32)(piVar4[4] != 0);
    }
    (features->mesh_shader_nv).taskShader = VVar9;
    if ((features->mesh_shader_nv).meshShader != 0) {
      VVar7 = (VkBool32)(piVar4[5] != 0);
    }
    (features->mesh_shader_nv).meshShader = VVar7;
  }
  for (; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9f9c62) goto LAB_001072f5;
  }
  piVar3 = (int *)0x0;
LAB_001072f5:
  if (piVar3 == (int *)0x0) {
    (features->descriptor_buffer).descriptorBuffer = 0;
    (features->descriptor_buffer).descriptorBufferCaptureReplay = 0;
    (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = 0;
    (features->descriptor_buffer).descriptorBufferPushDescriptors = 0;
  }
  else {
    uVar5 = 0;
    VVar7 = 0;
    if ((features->descriptor_buffer).descriptorBuffer != 0) {
      VVar7 = (VkBool32)(piVar3[4] != 0);
    }
    (features->descriptor_buffer).descriptorBuffer = VVar7;
    if ((features->descriptor_buffer).descriptorBufferCaptureReplay != 0) {
      uVar5 = (uint)(piVar3[5] != 0);
    }
    (features->descriptor_buffer).descriptorBufferCaptureReplay = uVar5;
    uVar5 = 0;
    VVar7 = 0;
    if ((features->descriptor_buffer).descriptorBufferImageLayoutIgnored != 0) {
      VVar7 = (VkBool32)(piVar3[6] != 0);
    }
    (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = VVar7;
    if ((features->descriptor_buffer).descriptorBufferPushDescriptors != 0) {
      uVar5 = (uint)(piVar3[7] != 0);
    }
    (features->descriptor_buffer).descriptorBufferPushDescriptors = uVar5;
  }
  piVar4 = (int *)target_features->pNext;
  for (piVar3 = piVar4; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3ba224d0) goto LAB_001073a0;
  }
  piVar3 = (int *)0x0;
LAB_001073a0:
  uVar5 = 0;
  if ((piVar3 != (int *)0x0) && ((features->shader_object).shaderObject != 0)) {
    uVar5 = (uint)(piVar3[4] != 0);
  }
  (features->shader_object).shaderObject = uVar5;
  for (piVar3 = piVar4; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3ba09e30) goto LAB_001073e6;
  }
  piVar3 = (int *)0x0;
LAB_001073e6:
  if (piVar3 == (int *)0x0) {
    (features->primitives_generated_query).primitivesGeneratedQuery = 0;
    (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = 0;
    (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = 0;
  }
  else {
    uVar5 = 0;
    VVar7 = 0;
    if ((features->primitives_generated_query).primitivesGeneratedQuery != 0) {
      VVar7 = (VkBool32)(piVar3[4] != 0);
    }
    (features->primitives_generated_query).primitivesGeneratedQuery = VVar7;
    if ((features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams != 0) {
      uVar5 = (uint)(piVar3[6] != 0);
    }
    (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams = uVar5;
    if ((features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)(piVar3[5] != 0);
    }
    (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard = uVar5;
  }
  for (; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
    if (*piVar4 == 0x3ba0c928) goto LAB_0010747a;
  }
  piVar4 = (int *)0x0;
LAB_0010747a:
  if (piVar4 == (int *)0x0) {
    (features->image_2d_view_of_3d).image2DViewOf3D = 0;
    (features->image_2d_view_of_3d).sampler2DViewOf3D = 0;
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    if ((features->image_2d_view_of_3d).image2DViewOf3D != 0) {
      uVar6 = (uint)(piVar4[4] != 0);
    }
    (features->image_2d_view_of_3d).image2DViewOf3D = uVar6;
    if ((features->image_2d_view_of_3d).sampler2DViewOf3D != 0) {
      uVar5 = (uint)(piVar4[5] != 0);
    }
    (features->image_2d_view_of_3d).sampler2DViewOf3D = uVar5;
  }
LAB_001074c3:
  piVar4 = (int *)pdf->pNext;
  pdf->pNext = (void *)0x0;
  if (piVar4 != (int *)0x0) {
    ppvVar12 = &pdf->pNext;
    do {
      piVar3 = *(int **)(piVar4 + 2);
      iVar2 = *piVar4;
      if (iVar2 < 0x3b9fcb40) {
        if (iVar2 < 0x3b9f2730) {
          if (iVar2 == 0x3b9ddf10) {
            if ((piVar4[5] != 0) || (piVar4[4] != 0)) goto LAB_001076f2;
            ext = "VK_NV_mesh_shader";
          }
          else {
            if ((((iVar2 != 0x3b9e3cd3) || (piVar4[6] != 0)) || (piVar4[4] != 0)) ||
               (piVar4[5] != 0)) goto LAB_001076f2;
            ext = "VK_KHR_fragment_shading_rate";
          }
        }
        else if (iVar2 == 0x3b9f2730) {
          if (((piVar4[6] != 0) || (piVar4[4] != 0)) || (piVar4[5] != 0)) goto LAB_001076f2;
          ext = "VK_EXT_robustness2";
        }
        else if (iVar2 == 0x3b9f9c62) {
          if (((piVar4[4] != 0) || (piVar4[5] != 0)) || ((piVar4[6] != 0 || (piVar4[7] != 0))))
          goto LAB_001076f2;
          ext = "VK_EXT_descriptor_buffer";
        }
        else {
          if ((((iVar2 != 0x3b9fc371) || (piVar4[4] != 0)) || (piVar4[6] != 0)) || (piVar4[5] != 0))
          goto LAB_001076f2;
          ext = "VK_NV_fragment_shading_rate_enums";
        }
LAB_00107724:
        remove_extension(active_extensions,out_extension_count,ext);
      }
      else {
        if (0x3ba09e2f < iVar2) {
          if (iVar2 == 0x3ba09e30) {
            if (((piVar4[4] != 0) || (piVar4[6] != 0)) || (piVar4[5] != 0)) goto LAB_001076f2;
            ext = "VK_EXT_primitives_generated_query";
          }
          else if (iVar2 == 0x3ba0c928) {
            if ((piVar4[4] != 0) || (piVar4[5] != 0)) goto LAB_001076f2;
            ext = "VK_EXT_image_2d_view_of_3d";
          }
          else {
            if (iVar2 != 0x3ba224d0) goto LAB_001076f2;
            bVar13 = piVar4[4] != 0;
            if (bVar13) goto LAB_00107603;
            ext = "VK_EXT_shader_object";
          }
          goto LAB_00107724;
        }
        if (iVar2 == 0x3b9fcb40) {
          if (((piVar4[5] == 0) && (piVar4[4] == 0)) &&
             ((piVar4[6] == 0 && ((piVar4[7] == 0 && (piVar4[8] == 0)))))) {
            ext = "VK_EXT_mesh_shader";
            goto LAB_00107724;
          }
        }
        else if (iVar2 == 0x3b9fe698) {
          bVar13 = piVar4[4] != 0;
          if (piVar4[4] == 0) {
            ext = "VK_EXT_image_robustness";
            goto LAB_00107724;
          }
LAB_00107603:
          if (bVar13) goto LAB_001076f2;
          goto LAB_00107701;
        }
LAB_001076f2:
        *ppvVar12 = piVar4;
        ppvVar12 = (void **)(piVar4 + 2);
        piVar4[2] = 0;
        piVar4[3] = 0;
      }
LAB_00107701:
      piVar4 = piVar3;
    } while (piVar3 != (int *)0x0);
  }
  return;
}

Assistant:

void filter_feature_enablement(VkPhysicalDeviceFeatures2 &pdf,
                               VulkanFeatures &features,
                               const VkPhysicalDeviceFeatures2 *target_features,
							   const char **active_extensions, size_t *out_extension_count)
{
	filter_feature_enablement(pdf, features, target_features);
	filter_active_extensions(pdf, active_extensions, out_extension_count);
}